

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O1

int Abc_CommandGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Pla_Man_t *pPVar6;
  char *pcVar7;
  uint fVerbose;
  char *pcVar8;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  local_4c = 0;
  Extra_UtilGetoptReset();
  local_44 = 0x14;
  local_48 = 1;
  local_50 = 8;
  bVar1 = false;
  bVar2 = false;
  fVerbose = 0;
LAB_003fd560:
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"IOPSspvh"), iVar3 = globalUtilOptind, iVar4 == 0x76)
    {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar4 < 0x50) {
      if (iVar4 == -1) {
        if (bVar1) {
          Pla_GenSorter(local_50);
          pPVar6 = (Pla_Man_t *)0x0;
        }
        else if (bVar2) {
          pPVar6 = Pla_ManPrimesDetector(local_50);
        }
        else {
          Gia_ManRandom(1);
          for (; local_4c != 0; local_4c = local_4c - 1) {
            Gia_ManRandom(0);
          }
          pPVar6 = Pla_ManGenerate(local_50,local_48,local_44,fVerbose);
        }
        Pla_AbcFreeMan(pAbc);
        pAbc->pAbcPla = pPVar6;
        return 0;
      }
      if (iVar4 == 0x49) {
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
LAB_003fd705:
          Abc_Print(-1,pcVar7);
          goto LAB_003fd711;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_50 = uVar5;
      }
      else {
        if (iVar4 != 0x4f) goto LAB_003fd711;
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-O\" should be followed by an integer.\n";
          goto LAB_003fd705;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_48 = uVar5;
      }
    }
    else {
      if (0x6f < iVar4) {
        if (iVar4 == 0x70) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else {
          if (iVar4 != 0x73) goto LAB_003fd711;
          bVar1 = (bool)(bVar1 ^ 1);
        }
        goto LAB_003fd560;
      }
      if (iVar4 == 0x50) {
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-P\" should be followed by an integer.\n";
          goto LAB_003fd705;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_44 = uVar5;
      }
      else {
        if (iVar4 != 0x53) goto LAB_003fd711;
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_003fd705;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_4c = uVar5;
      }
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar5 < 0) {
LAB_003fd711:
      Abc_Print(-2,"usage: |gen [-IOPS num] [-spvh]\n");
      Abc_Print(-2,"\t         generate random or specialized SOP\n");
      Abc_Print(-2,"\t-I num : the number of inputs [default = %d]\n",(ulong)local_50);
      Abc_Print(-2,"\t-O num : the number of outputs [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-P num : the number of products [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-S num : ramdom seed (0 <= num <= 1000) [default = %d]\n",(ulong)local_4c);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle generating sorter as a PLA file [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle generating prime detector [default = %s]\n",pcVar7);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandGen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Pla_GenSorter( int nVars );
    Pla_Man_t * p  = NULL;
    int nInputs      =  8;
    int nOutputs     =  1;
    int nCubes       = 20;
    int Seed         =  0;
    int fSorter      =  0;
    int fPrimes      =  0;
    int c, fVerbose  =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOPSspvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInputs < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutputs < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubes < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            Seed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Seed < 0 )
                goto usage;
            break;
        case 's':
            fSorter ^= 1;
            break;
        case 'p':
            fPrimes ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fSorter )
        Pla_GenSorter( nInputs );
    else if ( fPrimes )
        p = Pla_ManPrimesDetector( nInputs );
    else
    {
        Gia_ManRandom( 1 );
        for ( c = 0; c < Seed; c++ )
            Gia_ManRandom( 0 );
        p = Pla_ManGenerate( nInputs, nOutputs, nCubes, fVerbose );
    }
    Pla_AbcUpdateMan( pAbc, p );
    return 0;
usage:
    Abc_Print( -2, "usage: |gen [-IOPS num] [-spvh]\n" );
    Abc_Print( -2, "\t         generate random or specialized SOP\n" );
    Abc_Print( -2, "\t-I num : the number of inputs [default = %d]\n", nInputs );
    Abc_Print( -2, "\t-O num : the number of outputs [default = %d]\n", nOutputs );
    Abc_Print( -2, "\t-P num : the number of products [default = %d]\n", nCubes );
    Abc_Print( -2, "\t-S num : ramdom seed (0 <= num <= 1000) [default = %d]\n", Seed );
    Abc_Print( -2, "\t-s     : toggle generating sorter as a PLA file [default = %s]\n", fSorter? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle generating prime detector [default = %s]\n", fPrimes? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}